

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_thread.cxx
# Opt level: O1

int ndiEventWait(pl_cond_and_mutex_t *event,int milliseconds)

{
  pthread_mutex_t *ppVar1;
  int iVar2;
  uint uVar3;
  timeval tv;
  timespec ts;
  timeval local_40;
  timespec local_30;
  
  if (milliseconds < 0) {
    ppVar1 = &event->mutex;
    pthread_mutex_lock((pthread_mutex_t *)ppVar1);
    if (event->signalled == 0) {
      pthread_cond_wait((pthread_cond_t *)&event->cond,(pthread_mutex_t *)ppVar1);
    }
    event->signalled = 0;
    pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    uVar3 = 0;
  }
  else {
    ppVar1 = &event->mutex;
    pthread_mutex_lock((pthread_mutex_t *)ppVar1);
    uVar3 = 0;
    if (event->signalled == 0) {
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      local_40.tv_sec = local_40.tv_sec + (ulong)(uint)milliseconds / 1000;
      local_40.tv_usec = (ulong)(((uint)milliseconds % 1000) * 1000) + local_40.tv_usec;
      if (999999 < local_40.tv_usec) {
        local_40.tv_usec = local_40.tv_usec + -1000000;
        local_40.tv_sec = local_40.tv_sec + 1;
      }
      local_30.tv_sec = local_40.tv_sec;
      local_30.tv_nsec = local_40.tv_usec * 1000;
      iVar2 = pthread_cond_timedwait
                        ((pthread_cond_t *)&event->cond,(pthread_mutex_t *)ppVar1,&local_30);
      uVar3 = (uint)(iVar2 == 0x6e);
    }
    if (uVar3 == 0) {
      event->signalled = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
  }
  return uVar3;
}

Assistant:

ndicapiExport int ndiEventWait(pl_cond_and_mutex_t* event, int milliseconds)
{
  int timedout = 0;

  if (milliseconds < 0)   /* do infinite wait */
  {
    pthread_mutex_lock(&event->mutex);
    if (event->signalled == 0)
    {
      pthread_cond_wait(&event->cond, &event->mutex);
    }
    event->signalled = 0;
    pthread_mutex_unlock(&event->mutex);
  }
  else   /* do timed wait */
  {
    struct timeval tv;
    struct timespec ts;

    pthread_mutex_lock(&event->mutex);
    if (event->signalled == 0)
    {
      /* all the time stuff is used to check for timeouts */
      gettimeofday(&tv, 0);
      tv.tv_sec += milliseconds / 1000; /* msec to sec */
      tv.tv_usec += (milliseconds % 1000) * 1000; /* msec to usec */
      if (tv.tv_usec >= 1000000)   /* if usec overflow */
      {
        tv.tv_usec -= 1000000;
        tv.tv_sec += 1;
      }
      /* convert timeval to timespec */
      ts.tv_sec = tv.tv_sec;
      ts.tv_nsec = tv.tv_usec * 1000;

#ifdef PTHREAD_COND_TIMEDWAIT_USES_TIMEVAL
      timedout = (pthread_cond_timedwait(&event->cond, &event->mutex, &tv) == ETIMEDOUT);
#else
      timedout = (pthread_cond_timedwait(&event->cond, &event->mutex, &ts) == ETIMEDOUT);
#endif
    }
    if (!timedout)
    {
      event->signalled = 0;
    }
    pthread_mutex_unlock(&event->mutex);
  }

  return timedout;
}